

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UniformCollection::~UniformCollection
          (UniformCollection *this)

{
  StructType *this_00;
  pointer pUVar1;
  long *plVar2;
  pointer ppSVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer pUVar6;
  
  ppSVar3 = (this->m_structTypes).
            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_structTypes).
                              super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3) >> 3)) {
    lVar4 = 0;
    do {
      this_00 = ppSVar3[lVar4];
      if (this_00 != (StructType *)0x0) {
        glu::StructType::~StructType(this_00);
        operator_delete(this_00,0x38);
      }
      lVar4 = lVar4 + 1;
      ppSVar3 = (this->m_structTypes).
                super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar4 < (int)((ulong)((long)(this->m_structTypes).
                                         super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3)
                          >> 3));
  }
  if (ppSVar3 != (pointer)0x0) {
    operator_delete(ppSVar3,(long)(this->m_structTypes).
                                  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar3
                   );
  }
  pUVar6 = (this->m_uniforms).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar1 = (this->m_uniforms).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pUVar6 != pUVar1) {
    paVar5 = &(pUVar6->name).field_2;
    do {
      glu::VarType::~VarType((VarType *)(paVar5 + 1));
      plVar2 = (long *)(((string *)(paVar5 + -1))->_M_dataplus)._M_p;
      if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
        operator_delete(plVar2,paVar5->_M_allocated_capacity + 1);
      }
      pUVar6 = (pointer)((long)paVar5 + 0x28);
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)paVar5 + 0x38);
    } while (pUVar6 != pUVar1);
  }
  pUVar6 = (this->m_uniforms).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pUVar6 != (pointer)0x0) {
    operator_delete(pUVar6,(long)(this->m_uniforms).
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pUVar6);
    return;
  }
  return;
}

Assistant:

~UniformCollection	(void)
	{
		for (int i = 0; i < (int)m_structTypes.size(); i++)
			delete m_structTypes[i];
	}